

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcExtract.c
# Opt level: O0

void Abc_NtkTraverseSupersAnd_rec(Abc_ShaMan_t *p,Abc_Obj_t *pObj,Vec_Ptr_t *vInputs)

{
  Vec_Int_t *p_00;
  Abc_Ntk_t *pAVar1;
  int iVar2;
  int iVar3;
  Vec_Wrd_t *p_01;
  word wVar4;
  Abc_Obj_t *pAVar5;
  Vec_Int_t *local_40;
  Vec_Int_t *vInput;
  int k;
  word Num;
  Vec_Wrd_t *vSuper;
  Vec_Ptr_t *vInputs_local;
  Abc_Obj_t *pObj_local;
  Abc_ShaMan_t *p_local;
  
  iVar2 = Abc_NodeIsTravIdCurrent(pObj);
  if (iVar2 == 0) {
    Abc_NodeSetTravIdCurrent(pObj);
    iVar2 = Abc_ObjIsCi(pObj);
    if (iVar2 == 0) {
      iVar2 = Abc_ObjIsNode(pObj);
      if (iVar2 == 0) {
        __assert_fail("Abc_ObjIsNode(pObj)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcExtract.c"
                      ,0x121,
                      "void Abc_NtkTraverseSupersAnd_rec(Abc_ShaMan_t *, Abc_Obj_t *, Vec_Ptr_t *)")
        ;
      }
      p_01 = Abc_NtkShareSuperAnd(pObj,&p->nFoundGates);
      iVar2 = Vec_WrdSize(p_01);
      if ((iVar2 < 2) || (iVar2 = Vec_WrdSize(p_01), p->nMultiSize <= iVar2)) {
        for (vInput._4_4_ = 0; iVar2 = Vec_WrdSize(p_01), vInput._4_4_ < iVar2;
            vInput._4_4_ = vInput._4_4_ + 1) {
          wVar4 = Vec_WrdEntry(p_01,vInput._4_4_);
          iVar2 = (int)wVar4;
          local_40 = (Vec_Int_t *)Vec_PtrEntry(vInputs,iVar2);
          if (local_40 == (Vec_Int_t *)0x0) {
            local_40 = Vec_IntAlloc(10);
            Vec_IntPush(local_40,iVar2);
            pAVar1 = p->pNtk;
            iVar3 = Abc_Lit2Var(iVar2);
            pAVar5 = Abc_NtkObj(pAVar1,iVar3);
            iVar3 = Abc_ObjLevel(pAVar5);
            Vec_IntPush(local_40,iVar3);
            iVar3 = Vec_IntSize(local_40);
            if (iVar3 != 2) {
              __assert_fail("SHARE_NUM == Vec_IntSize(vInput)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcExtract.c"
                            ,0x12d,
                            "void Abc_NtkTraverseSupersAnd_rec(Abc_ShaMan_t *, Abc_Obj_t *, Vec_Ptr_t *)"
                           );
            }
            Vec_PtrWriteEntry(vInputs,iVar2,local_40);
          }
          iVar2 = Vec_IntSize(p->vObj2Lit);
          Vec_IntPush(local_40,iVar2);
        }
        p_00 = p->vObj2Lit;
        iVar2 = Abc_ObjToLit(pObj);
        Vec_IntPush(p_00,iVar2);
      }
      for (vInput._4_4_ = 0; iVar2 = Vec_WrdSize(p_01), vInput._4_4_ < iVar2;
          vInput._4_4_ = vInput._4_4_ + 1) {
        wVar4 = Vec_WrdEntry(p_01,vInput._4_4_);
        pAVar1 = p->pNtk;
        iVar2 = Abc_Lit2Var((int)wVar4);
        pAVar5 = Abc_NtkObj(pAVar1,iVar2);
        Abc_NtkTraverseSupersAnd_rec(p,pAVar5,vInputs);
      }
      Vec_WrdFree(p_01);
    }
  }
  return;
}

Assistant:

void Abc_NtkTraverseSupersAnd_rec( Abc_ShaMan_t * p, Abc_Obj_t * pObj, Vec_Ptr_t * vInputs )
{
    Vec_Wrd_t * vSuper;
    word Num;
    int k;
    if ( Abc_NodeIsTravIdCurrent( pObj ) )
        return;
    Abc_NodeSetTravIdCurrent( pObj );
    if ( Abc_ObjIsCi(pObj) )
        return;
    assert( Abc_ObjIsNode(pObj) );
    vSuper = Abc_NtkShareSuperAnd( pObj, &p->nFoundGates );
    if ( Vec_WrdSize(vSuper) <= 1 || Vec_WrdSize(vSuper) >= p->nMultiSize )
    {
        Vec_WrdForEachEntry( vSuper, Num, k )
        {
            Vec_Int_t * vInput = (Vec_Int_t *)Vec_PtrEntry( vInputs, (int)Num );
            if ( vInput == NULL )
            {
                vInput = Vec_IntAlloc( 10 );
                Vec_IntPush( vInput, (int)Num );
                Vec_IntPush( vInput, Abc_ObjLevel(Abc_NtkObj(p->pNtk, Abc_Lit2Var((int)Num))) );
                assert( SHARE_NUM == Vec_IntSize(vInput) );
                Vec_PtrWriteEntry( vInputs, (int)Num, vInput );
            }
            Vec_IntPush( vInput, Vec_IntSize(p->vObj2Lit) );
        }
        Vec_IntPush( p->vObj2Lit, Abc_ObjToLit(pObj) );
    }
    // call recursively
    Vec_WrdForEachEntry( vSuper, Num, k )
        Abc_NtkTraverseSupersAnd_rec( p, Abc_NtkObj(p->pNtk, Abc_Lit2Var((int)Num)), vInputs );
    Vec_WrdFree( vSuper );
}